

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O1

bool el::Configurations::Parser::parseFromFile
               (string *configurationFile,Configurations *sender,Configurations *base)

{
  long lVar1;
  char cVar2;
  bool bVar3;
  ostream *poVar4;
  string line;
  Level currLevel;
  string currLevelStr;
  string currConfigStr;
  stringstream internalInfoStream;
  ifstream fileStream_;
  string local_448;
  Level local_424;
  long *local_420;
  long local_418;
  long local_410 [2];
  string local_400;
  string local_3e0;
  stringstream local_3c0 [16];
  ostream local_3b0 [112];
  ios_base local_340 [264];
  long local_238 [4];
  int aiStack_218 [122];
  
  setFromBase(sender,base);
  std::ifstream::ifstream(local_238,(configurationFile->_M_dataplus)._M_p,_S_in);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    std::__cxx11::stringstream::stringstream(local_3c0);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_3b0,"Unable to open configuration file [",0x23);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_3b0,(configurationFile->_M_dataplus)._M_p,
                        configurationFile->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] for parsing.",0xe);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"ASSERTION FAILURE FROM EASYLOGGING++ (LINE: ",0x2c);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x14e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") [fileStream_.is_open()",0x18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] WITH MESSAGE \"",0x10);
    std::__cxx11::stringbuf::str();
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_448._M_dataplus._M_p,local_448._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_448._M_dataplus._M_p != &local_448.field_2) {
      operator_delete(local_448._M_dataplus._M_p,
                      CONCAT71(local_448.field_2._M_allocated_capacity._1_7_,
                               local_448.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_3c0);
    std::ios_base::~ios_base(local_340);
  }
  local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
  bVar3 = false;
  local_448._M_string_length = 0;
  local_448.field_2._M_local_buf[0] = '\0';
  local_424 = Unknown;
  local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
  local_3e0._M_string_length = 0;
  local_3e0.field_2._M_local_buf[0] = '\0';
  local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
  local_400._M_string_length = 0;
  local_400.field_2._M_local_buf[0] = '\0';
  lVar1 = *(long *)(local_238[0] + -0x18);
  if (*(int *)((long)aiStack_218 + lVar1) == 0) {
    do {
      cVar2 = std::ios::widen((char)&local_448 + (char)lVar1 + '\x10');
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_238,(string *)&local_448,cVar2);
      bVar3 = parseLine(&local_448,&local_3e0,&local_400,&local_424,sender);
      if (!bVar3) {
        std::__cxx11::stringstream::stringstream(local_3c0);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_3b0,"Unable to parse configuration line: ",0x24);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_3b0,local_448._M_dataplus._M_p,local_448._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"ASSERTION FAILURE FROM EASYLOGGING++ (LINE: ",0x2c);
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x157);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,") [parsedSuccessfully",0x15);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] WITH MESSAGE \"",0x10);
        std::__cxx11::stringbuf::str();
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(char *)local_420,local_418);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        if (local_420 != local_410) {
          operator_delete(local_420,local_410[0] + 1);
        }
        std::__cxx11::stringstream::~stringstream(local_3c0);
        std::ios_base::~ios_base(local_340);
      }
      lVar1 = *(long *)(local_238[0] + -0x18);
    } while (*(int *)((long)aiStack_218 + lVar1) == 0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400._M_dataplus._M_p != &local_400.field_2) {
    operator_delete(local_400._M_dataplus._M_p,
                    CONCAT71(local_400.field_2._M_allocated_capacity._1_7_,
                             local_400.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
    operator_delete(local_3e0._M_dataplus._M_p,
                    CONCAT71(local_3e0.field_2._M_allocated_capacity._1_7_,
                             local_3e0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != &local_448.field_2) {
    operator_delete(local_448._M_dataplus._M_p,
                    CONCAT71(local_448.field_2._M_allocated_capacity._1_7_,
                             local_448.field_2._M_local_buf[0]) + 1);
  }
  std::ifstream::~ifstream(local_238);
  return bVar3;
}

Assistant:

bool Configurations::Parser::parseFromFile(const std::string& configurationFile, Configurations* sender,
    Configurations* base) {
  sender->setFromBase(base);
  std::ifstream fileStream_(configurationFile.c_str(), std::ifstream::in);
  ELPP_ASSERT(fileStream_.is_open(), "Unable to open configuration file [" << configurationFile << "] for parsing.");
  bool parsedSuccessfully = false;
  std::string line = std::string();
  Level currLevel = Level::Unknown;
  std::string currConfigStr = std::string();
  std::string currLevelStr = std::string();
  while (fileStream_.good()) {
    std::getline(fileStream_, line);
    parsedSuccessfully = parseLine(&line, &currConfigStr, &currLevelStr, &currLevel, sender);
    ELPP_ASSERT(parsedSuccessfully, "Unable to parse configuration line: " << line);
  }
  return parsedSuccessfully;
}